

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O0

void copy<unsigned_char*,16u,unsigned_char**>(vector_bagwell<unsigned_char_*,_16U> *v,uchar **dst)

{
  uchar **__first;
  size_type sVar1;
  const_reference pppuVar2;
  ulong local_28;
  size_t i;
  size_t bufsize;
  uchar **dst_local;
  vector_bagwell<unsigned_char_*,_16U> *v_local;
  
  i = 0x10;
  local_28 = 1;
  bufsize = (size_t)dst;
  while( true ) {
    sVar1 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::size(&v->_index_block)
    ;
    if (sVar1 <= local_28) break;
    pppuVar2 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::operator[]
                         (&v->_index_block,local_28 - 1);
    __first = *pppuVar2;
    pppuVar2 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::operator[]
                         (&v->_index_block,local_28 - 1);
    std::copy<unsigned_char**,unsigned_char**>(__first,*pppuVar2 + i,(uchar **)bufsize);
    bufsize = i * 8 + bufsize;
    i = i << 1;
    local_28 = local_28 + 1;
  }
  pppuVar2 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::back
                       (&v->_index_block);
  std::copy<unsigned_char**,unsigned_char**>(*pppuVar2,v->_insertpos,(uchar **)bufsize);
  return;
}

Assistant:

static inline void
copy(const vector_bagwell<T, InitialSize>& v, OutputIterator dst)
{
	size_t bufsize = InitialSize;
	for (size_t i=1; i < v._index_block.size(); ++i) {
		std::copy(v._index_block[i-1],
		          v._index_block[i-1]+bufsize,
		          dst);
		dst += bufsize;
		bufsize *= 2;
	}
	std::copy(v._index_block.back(), v._insertpos, dst);
}